

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

void __thiscall HEkkDual::updatePrimal(HEkkDual *this,HVector *DSE_Vector)

{
  HEkkDualRHS *this_00;
  HVector *column;
  HEkk *pHVar1;
  pointer pdVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (this->rebuild_reason != 0) {
    return;
  }
  pHVar1 = this->ekk_instance_;
  if (this->edge_weight_mode == kDevex) {
    pdVar2 = (pHVar1->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    dVar6 = this->computed_edge_weight;
    dVar7 = pdVar2[this->row_out];
    pdVar2[this->row_out] = dVar6;
    auVar8._8_8_ = dVar6;
    auVar8._0_8_ = dVar7;
    auVar9._8_8_ = dVar7;
    auVar9._0_8_ = dVar6;
    auVar9 = divpd(auVar8,auVar9);
    iVar4 = (int)((double)this->solver_num_row / 0.01);
    iVar5 = 0x19;
    if (0x19 < iVar4) {
      iVar5 = iVar4;
    }
    dVar6 = auVar9._8_8_;
    if (auVar9._8_8_ <= auVar9._0_8_) {
      dVar6 = auVar9._0_8_;
    }
    this->new_devex_framework = iVar5 < this->num_devex_iterations || 9.0 < dVar6;
  }
  this_00 = &this->dualRHS;
  HEkkDualRHS::updatePrimal(this_00,&this->col_BFRT,1.0);
  HEkkDualRHS::updateInfeasList(this_00,&this->col_BFRT);
  dVar6 = (this->baseValue[this->row_out] -
          (&this->baseLower)[0.0 < this->delta_primal || this->delta_primal == 0.0][this->row_out])
          / this->alpha_col;
  this->theta_primal = dVar6;
  column = &this->col_aq;
  bVar3 = HEkkDualRHS::updatePrimal(this_00,column,dVar6);
  if (bVar3) {
    HEkk::updateBadBasisChange(this->ekk_instance_,column,this->theta_primal);
    if (this->edge_weight_mode == kDevex) {
      dVar6 = (pHVar1->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[this->row_out] /
              (this->alpha_col * this->alpha_col);
      if (dVar6 <= 1.0) {
        dVar6 = 1.0;
      }
      HEkk::updateDualDevexWeights(this->ekk_instance_,column,dVar6);
      (pHVar1->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[this->row_out] = dVar6;
      this->num_devex_iterations = this->num_devex_iterations + 1;
    }
    else if (this->edge_weight_mode == kSteepestEdge) {
      dVar6 = HSimplexNla::pivotInScaledSpace
                        (&this->ekk_instance_->simplex_nla_,column,this->variable_in,this->row_out);
      dVar7 = (pHVar1->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[this->row_out] / (dVar6 * dVar6);
      HEkk::updateDualSteepestEdgeWeights
                (this->ekk_instance_,this->row_out,this->variable_in,column,dVar7,-2.0 / dVar6,
                 (DSE_Vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (pHVar1->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[this->row_out] = dVar7;
    }
    HEkkDualRHS::updateInfeasList(this_00,column);
    this->ekk_instance_->total_synthetic_tick_ =
         (this->col_aq).synthetic_tick + this->ekk_instance_->total_synthetic_tick_ +
         DSE_Vector->synthetic_tick;
  }
  else {
    this->rebuild_reason = 0xb;
  }
  return;
}

Assistant:

void HEkkDual::updatePrimal(HVector* DSE_Vector) {
  // Update the primal values and any edge weights
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;
  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (edge_weight_mode == EdgeWeightMode::kDevex) {
    const double updated_edge_weight = edge_weight[row_out];
    edge_weight[row_out] = computed_edge_weight;
    new_devex_framework = newDevexFramework(updated_edge_weight);
  }
  // DSE_Vector is either col_DSE = B^{-1}B^{-T}e_p (if using dual
  // steepest edge weights) or row_ep = B^{-T}e_p.
  //
  // Update - primal and weight
  dualRHS.updatePrimal(&col_BFRT, 1);
  dualRHS.updateInfeasList(&col_BFRT);
  double x_out = baseValue[row_out];
  double l_out = baseLower[row_out];
  double u_out = baseUpper[row_out];
  theta_primal = (x_out - (delta_primal < 0 ? l_out : u_out)) / alpha_col;
  const bool ok_update_primal = dualRHS.updatePrimal(&col_aq, theta_primal);
  if (!ok_update_primal) {
    rebuild_reason = kRebuildReasonExcessivePrimalValue;
    return;
  }
  ekk_instance_.updateBadBasisChange(col_aq, theta_primal);
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    const double pivot_in_scaled_space =
        ekk_instance_.simplex_nla_.pivotInScaledSpace(&col_aq, variable_in,
                                                      row_out);
    if (ekk_instance_.simplex_in_scaled_space_)
      assert(pivot_in_scaled_space == alpha_col);
    const double new_pivotal_edge_weight =
        edge_weight[row_out] / (pivot_in_scaled_space * pivot_in_scaled_space);
    const double Kai = -2 / pivot_in_scaled_space;
    ekk_instance_.updateDualSteepestEdgeWeights(row_out, variable_in, &col_aq,
                                                new_pivotal_edge_weight, Kai,
                                                DSE_Vector->array.data());
    edge_weight[row_out] = new_pivotal_edge_weight;
  } else if (edge_weight_mode == EdgeWeightMode::kDevex) {
    // Pivotal row is for the current basis: weights are required for
    // the next basis so have to divide the current (exact) weight by
    // the pivotal value
    double new_pivotal_edge_weight =
        edge_weight[row_out] / (alpha_col * alpha_col);
    new_pivotal_edge_weight = max(1.0, new_pivotal_edge_weight);
    // nw_wt is max(use_edge_weight_[iRow], NewExactWeight*columnArray[iRow]^2);
    //
    // But NewExactWeight is new_pivotal_edge_weight = max(1.0,
    // edge_weight[row_out] / (alpha * alpha))
    //
    // so nw_wt = max(use_edge_weight_[iRow],
    // new_pivotal_edge_weight*columnArray[iRow]^2);
    //
    // Update rest of weights
    ekk_instance_.updateDualDevexWeights(&col_aq, new_pivotal_edge_weight);
    edge_weight[row_out] = new_pivotal_edge_weight;
    num_devex_iterations++;
  }
  dualRHS.updateInfeasList(&col_aq);

  // Whether or not dual steepest edge weights are being used, have to
  // add in DSE_Vector->synthetic_tick_ since this contains the
  // contribution from forming row_ep = B^{-T}e_p.
  ekk_instance_.total_synthetic_tick_ += col_aq.synthetic_tick;
  ekk_instance_.total_synthetic_tick_ += DSE_Vector->synthetic_tick;
}